

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

trie_node trie_node_get(trie t,vector keys)

{
  size_t sVar1;
  set s;
  set_value pvVar2;
  vector in_RSI;
  undefined8 *in_RDI;
  trie_node_ref node_ref;
  trie_node next_node;
  trie_key *key_ptr;
  trie_node current_node;
  size_t size;
  size_t iterator;
  vector in_stack_ffffffffffffffa8;
  trie_node ptVar3;
  trie_node local_30;
  ulong local_20;
  
  if (in_RDI != (undefined8 *)0x0) {
    sVar1 = vector_size(in_RSI);
    local_30 = (trie_node)*in_RDI;
    for (local_20 = 0; local_30 != (trie_node)0x0 && local_20 < sVar1; local_20 = local_20 + 1) {
      s = (set)vector_at(in_stack_ffffffffffffffa8,0x105e6a);
      ptVar3 = (trie_node)0x0;
      if ((local_30->childs != (set)0x0) &&
         (pvVar2 = set_get(s,(set_key)0x0), pvVar2 != (set_value)0x0)) {
        ptVar3 = (trie_node)(in_RDI[1] + *(long *)((long)pvVar2 + 8) * 0x28);
      }
      if ((local_20 == sVar1 - 1) && (ptVar3 != (trie_node)0x0)) {
        return ptVar3;
      }
      local_30 = ptVar3;
    }
  }
  return (trie_node)0x0;
}

Assistant:

trie_node trie_node_get(trie t, vector keys)
{
	if (t != NULL)
	{
		size_t iterator, size = vector_size(keys);

		trie_node current_node = t->root;

		for (iterator = 0; current_node != NULL && iterator < size; ++iterator)
		{
			trie_key *key_ptr = vector_at(keys, iterator);

			trie_node next_node = NULL;

			if (current_node->childs != NULL)
			{
				trie_node_ref node_ref = set_get(current_node->childs, *key_ptr);

				if (node_ref != NULL)
				{
					next_node = &t->node_list[node_ref->index];
				}
			}

			if (iterator == (size - 1) && next_node != NULL)
			{
				return next_node;
			}

			current_node = next_node;
		}
	}

	return NULL;
}